

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void __thiscall license::Project::~Project(Project *this)

{
  Project *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_templates_folder);
  std::__cxx11::string::~string((string *)&this->m_project_folder);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Project::~Project() {}